

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_container_get_range(bitset_container_t *bitset,uint32_t pos_start,uint32_t pos_end)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ushort local_3a;
  uint16_t i;
  uint64_t last;
  uint64_t first;
  uint32_t end;
  uint32_t start;
  uint32_t pos_end_local;
  uint32_t pos_start_local;
  bitset_container_t *bitset_local;
  
  uVar1 = pos_start >> 6;
  uVar2 = pos_end >> 6;
  uVar3 = (1L << ((byte)pos_start & 0x3f)) - 1U ^ 0xffffffffffffffff;
  uVar4 = (1L << ((byte)pos_end & 0x3f)) - 1;
  if (uVar1 == uVar2) {
    bitset_local._7_1_ = (bitset->words[uVar2] & uVar3 & uVar4) == (uVar3 & uVar4);
  }
  else if ((bitset->words[uVar1] & uVar3) == uVar3) {
    if ((uVar2 < 0x400) && ((bitset->words[uVar2] & uVar4) != uVar4)) {
      bitset_local._7_1_ = false;
    }
    else {
      local_3a = (ushort)uVar1;
      do {
        local_3a = local_3a + 1;
        if (0x3ff < local_3a || uVar2 <= local_3a) {
          return true;
        }
      } while (bitset->words[local_3a] == 0xffffffffffffffff);
      bitset_local._7_1_ = false;
    }
  }
  else {
    bitset_local._7_1_ = false;
  }
  return bitset_local._7_1_;
}

Assistant:

static inline bool bitset_container_get_range(const bitset_container_t *bitset,
                                                uint32_t pos_start, uint32_t pos_end) {

    const uint32_t start = pos_start >> 6;
    const uint32_t end = pos_end >> 6;

    const uint64_t first = ~((1ULL << (pos_start & 0x3F)) - 1);
    const uint64_t last = (1ULL << (pos_end & 0x3F)) - 1;

    if (start == end) return ((bitset->words[end] & first & last) == (first & last));
    if ((bitset->words[start] & first) != first) return false;

    if ((end < BITSET_CONTAINER_SIZE_IN_WORDS) && ((bitset->words[end] & last) != last)){

        return false;
    }

    for (uint16_t i = start + 1; (i < BITSET_CONTAINER_SIZE_IN_WORDS) && (i < end); ++i){

        if (bitset->words[i] != UINT64_C(0xFFFFFFFFFFFFFFFF)) return false;
    }

    return true;
}